

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeAsyncHandler.hpp
# Opt level: O2

void __thiscall
ableton::util::SafeAsyncHandler<ableton::discovery::Socket<512ul>::Impl>::operator()
          (void *this,error_code *t,unsigned_long *t_1)

{
  shared_ptr<ableton::discovery::Socket<512UL>::Impl> pDelegate;
  __shared_ptr<ableton::discovery::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<ableton::discovery::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_28,this);
  if (local_28._M_ptr != (Impl *)0x0) {
    discovery::Socket<512UL>::Impl::operator()(local_28._M_ptr,t,*t_1);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

void operator()(T&&... t) const
  {
    std::shared_ptr<Delegate> pDelegate = mpDelegate.lock();
    if (pDelegate)
    {
      (*pDelegate)(std::forward<T>(t)...);
    }
  }